

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O1

bool __thiscall chatra::Thread::assignmentOperator(Thread *this)

{
  pointer *ppuVar1;
  Frame *this_00;
  pointer *pppVar2;
  int iVar3;
  StringId SVar4;
  Type TVar5;
  pointer pFVar6;
  pointer ppVar7;
  pointer ppTVar8;
  Tuple *pTVar9;
  long *plVar10;
  size_t *psVar11;
  size_t position;
  pointer pcVar12;
  pointer pRVar13;
  __node_base_ptr p_Var14;
  TemporaryObject *pTVar15;
  iterator __position;
  Node *pNVar16;
  EvaluateValueResult EVar17;
  ulong uVar18;
  Reference RVar19;
  Array *this_01;
  Dict *this_02;
  pointer pbVar20;
  long lVar21;
  Key *pKVar22;
  __node_base_ptr p_Var23;
  Reference *pRVar24;
  Class *pCVar25;
  TemporaryObject *pTVar26;
  Method *pMVar27;
  undefined8 *puVar28;
  __hash_code __code;
  pointer pbVar29;
  unsigned_long uVar30;
  pointer puVar31;
  undefined1 auVar32 [8];
  unsigned_long *puVar33;
  ulong uVar34;
  pointer puVar35;
  pointer_____offset_0x10___ *ppuVar36;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_03;
  __node_base_ptr p_Var37;
  iterator __beg;
  _Hash_node_base *p_Var38;
  const_iterator __end5;
  long *plVar39;
  size_t *psVar40;
  ReferenceNode *pRVar41;
  byte unaff_R15B;
  bool bVar42;
  bool bVar43;
  ArgumentSpec arg;
  ArgumentSpec arg_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_218;
  unsigned_long local_200;
  size_t destIndex;
  string local_1f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1d0;
  undefined1 local_1b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> srcIndexes;
  undefined1 auStack_198 [8];
  vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
  map;
  undefined1 local_178 [48];
  ReferenceNode *local_148;
  bool local_130;
  bool local_12f;
  _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_unsigned_long>,_std::allocator<std::pair<const_chatra::StringId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_128;
  Type local_ec;
  ulong local_e8;
  undefined1 local_e0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> destIndexes;
  Reference ref;
  Reference RStack_98;
  Reference srcRef;
  undefined1 auStack_68 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> empty;
  ReferenceNode *local_48;
  size_t srcIndex;
  Thread *local_38;
  
  pFVar6 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pFVar6 + -1;
  ppVar7 = pFVar6[-1].stack.
           super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  srcIndex = (size_t)ppVar7[-1].first;
  uVar34 = ppVar7[-1].second;
  local_38 = this;
  if (0x14 < uVar34) {
    if (uVar34 == 0x1e) {
      pFVar6[-1].stack.
      super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar7 + -1;
      unaff_R15B = 0;
      methodCallViaFunctionObject(this,true,(Method *)0x0);
      goto LAB_001614a4;
    }
switchD_00160535_caseD_4:
    if (uVar34 < 0x28) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar28 = &PTR__exception_002469b8;
      ppuVar36 = &InternalError::typeinfo;
      goto LAB_001615b7;
    }
    ppTVar8 = pFVar6[-1].values.
              super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar30 = pFVar6[-1].subStack.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1];
    destIndex = (size_t)((ppTVar8[uVar30 - 2]->targetRef).node)->object;
    pTVar9 = (Tuple *)((ppTVar8[uVar30 - 1]->targetRef).node)->object;
    srcIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)((ppTVar8[uVar30]->targetRef).node)->object
    ;
    do {
      local_e8 = ppVar7[-1].second - 0x28;
      uVar34 = local_e8 >> 2;
      switch((uint)ppVar7[-1].second & 3) {
      case 0:
        uVar30 = srcIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage[0x16];
        uVar18 = ((long)(srcIndexes.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[0x17] - uVar30) >> 3) *
                 -0x3333333333333333;
        if (uVar34 <= uVar18 && uVar18 - uVar34 != 0) {
          TemporaryTuple::extract((TemporaryTuple *)destIndex,*(size_t *)(uVar30 + uVar34 * 0x28));
          iVar3 = *(int *)(uVar30 + 0x20 + uVar34 * 0x28);
          if (iVar3 == 3) {
            pCVar25 = Dict::getClassStatic();
          }
          else if (iVar3 == 1) {
            pCVar25 = Array::getClassStatic();
          }
          else {
            lVar21 = uVar30 + uVar34 * 0x28;
            plVar39 = *(long **)(lVar21 + 8);
            if (plVar39 == *(long **)(lVar21 + 0x10)) {
              pCVar25 = (Class *)0x0;
            }
            else {
              pCVar25 = getReferClass((pTVar9->super_ObjectBase).super_Object.refsArray.
                                      super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>
                                      ._M_impl.super__Vector_impl_data._M_start[*plVar39].node);
            }
          }
          if (pCVar25 != (Class *)0x0) {
            arg.cl = pCVar25;
            arg._0_8_ = 0xffffffff;
            TemporaryObject::addAssignment
                      (pFVar6[-1].values.
                       super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1],(Node *)srcIndex,arg);
          }
          ppVar7[-1].second = ppVar7[-1].second + 1;
          goto switchD_001605fb_caseD_1;
        }
        Frame::popTemporaryTuple(this_00);
        Frame::pop(this_00);
        Frame::pop(this_00);
        Frame::pop(this_00);
        pTVar26 = Frame::pushTemporary(this_00);
        RVar19 = TemporaryObject::setRvalue(pTVar26);
        (RVar19.node)->type = Object;
        (RVar19.node)->object = (Object *)0x0;
        pppVar2 = &pFVar6[-1].stack.
                   super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar2 = *pppVar2 + -1;
        ppuVar1 = &pFVar6[-1].subStack.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + -1;
        unaff_R15B = 1;
        bVar42 = false;
        goto LAB_00160a06;
      case 1:
switchD_001605fb_caseD_1:
        EVar17 = evaluateAndAllocateForAssignment
                           (local_38,(Node *)**(undefined8 **)(srcIndex + 0x60),
                            pFVar6[-1].values.
                            super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1]);
        if (EVar17 == Next) goto switchD_001605fb_caseD_2;
        goto LAB_00160a03;
      case 2:
switchD_001605fb_caseD_2:
        pTVar26 = pFVar6[-1].values.
                  super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1];
        TVar5 = pTVar26->type;
        if ((1 < TVar5 - ScopeRef) &&
           ((1 < TVar5 - FrameMethod ||
            (pMVar27 = TemporaryObject::getSetMethod(pTVar26), pMVar27 == (Method *)0x0)))) {
          pNVar16 = (Node *)**(undefined8 **)(srcIndex + 0x60);
          local_178._0_8_ = local_178 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_178,"expression is not assignable","");
          auStack_68 = (undefined1  [8])0x0;
          empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          errorAtNode(&local_38->super_IErrorReceiver,Error,pNVar16,(string *)local_178,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_68);
          goto LAB_00161580;
        }
        ppVar7[-1].second = ppVar7[-1].second + 1;
      }
      lVar21 = srcIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[0x16] + uVar34 * 0x28;
      pTVar26 = Frame::pushTemporary(this_00);
      RStack_98 = TemporaryObject::setRvalue(pTVar26);
      if (*(int *)(lVar21 + 0x20) == 3) {
        this_02 = Reference::allocateWithoutLock<chatra::Dict>(&RStack_98);
        psVar11 = *(size_t **)(lVar21 + 0x10);
        for (psVar40 = *(size_t **)(lVar21 + 8); psVar40 != psVar11; psVar40 = psVar40 + 1) {
          position = *psVar40;
          pKVar22 = Tuple::key(pTVar9,position);
          uVar34 = (ulong)pKVar22->sid;
          if (uVar34 == 0xffffffff) {
            pbVar29 = &pKVar22->str;
            pbVar20 = &pKVar22->str;
          }
          else {
            pbVar20 = (local_38->sTable->idToStr).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar29 = pbVar20 + uVar34;
            pbVar20 = pbVar20 + uVar34;
          }
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          pcVar12 = (pbVar29->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1f0,pcVar12,pcVar12 + pbVar20->_M_string_length);
          Dict::add(this_02,&local_1f0,
                    (pTVar9->super_ObjectBase).super_Object.refsArray.
                    super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                    _M_impl.super__Vector_impl_data._M_start[position].node);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p);
          }
        }
      }
      else if (*(int *)(lVar21 + 0x20) == 1) {
        this_01 = Reference::allocateWithoutLock<chatra::Array>(&RStack_98);
        plVar10 = *(long **)(lVar21 + 0x10);
        for (plVar39 = *(long **)(lVar21 + 8); plVar39 != plVar10; plVar39 = plVar39 + 1) {
          Array::add(this_01,(pTVar9->super_ObjectBase).super_Object.refsArray.
                             super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>
                             ._M_impl.super__Vector_impl_data._M_start[*plVar39].node);
        }
      }
      else if (*(long *)(lVar21 + 8) == *(long *)(lVar21 + 0x10)) {
        (RStack_98.node)->type = Object;
        (RStack_98.node)->object = (Object *)0x0;
      }
      else {
        local_178._0_8_ =
             (pTVar9->super_ObjectBase).super_Object.refsArray.
             super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
             super__Vector_impl_data._M_start[**(long **)(lVar21 + 8)].node;
        Reference::setWithoutBothLock(&RStack_98,(Reference *)local_178);
      }
      pTVar26 = pFVar6[-1].values.
                super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                ._M_impl.super__Vector_impl_data._M_finish[-2];
      bVar42 = TemporaryObject::hasRef(pTVar26);
      if (bVar42) {
        bVar42 = lockReference(local_38,pTVar26);
        if (!bVar42) goto LAB_00160a03;
        destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(pTVar26->targetRef).node;
        if (((ReferenceNode *)
            destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage)->group->isConst == true) {
          pNVar16 = (Node *)**(undefined8 **)(srcIndex + 0x60);
          local_178._0_8_ = local_178 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_178,"cannot modify constant reference","");
          auStack_68 = (undefined1  [8])0x0;
          empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          errorAtNode(&local_38->super_IErrorReceiver,Error,pNVar16,(string *)local_178,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_68);
          goto LAB_00161580;
        }
        if ((pTVar26->hasArgs == true) &&
           (pCVar25 = getReferClass((Reference)
                                    destIndexes.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage),
           pCVar25 == (Class *)PreDefined<chatra::FunctionObject,(chatra::StringId)159>::pdCl)) {
          ppVar7[-1].second = (local_e8 & 0xfffffffffffffffc) + 0x2c;
          methodCallViaFunctionObject(local_38,true,(Method *)0x0);
          goto LAB_00160a03;
        }
        Reference::setWithoutBothLock
                  ((Reference *)
                   &destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,&RStack_98);
        Frame::pop(this_00);
        Frame::pop(this_00);
        ppVar7[-1].second = (local_e8 & 0xfffffffffffffffc) + 0x2c;
        bVar42 = true;
      }
      else {
        ppVar7[-1].second = (local_e8 & 0xfffffffffffffffc) + 0x2c;
        methodCall(local_38,true);
LAB_00160a03:
        bVar42 = false;
        unaff_R15B = 0;
      }
LAB_00160a06:
    } while (bVar42);
    goto LAB_001614a4;
  }
  switch(uVar34) {
  case 0:
    ppVar7[-1].second = 1;
    local_178._0_8_ =
         (((((Node *)srcIndex)->subNodes).
           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    break;
  case 1:
    ppVar7[-1].second = 2;
    local_178._0_8_ =
         (((Node *)srcIndex)->subNodes).
         super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
         ._M_impl.super__Vector_impl_data._M_start[1].
         super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    break;
  case 2:
    unaff_R15B = 0;
    EVar17 = evaluateValue(this,Value);
    if (EVar17 == Suspend) goto LAB_001614a4;
    if (EVar17 != StackChanged) goto switchD_00160535_caseD_3;
    goto LAB_001614a1;
  case 3:
switchD_00160535_caseD_3:
    ppVar7[-1].second = 6;
  case 6:
    ppTVar8 = pFVar6[-1].values.
              super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pTVar26 = ppTVar8[-2];
    pTVar15 = ppTVar8[-1];
    if (pTVar26->type == Rvalue) {
      pCVar25 = getReferClass((pTVar26->targetRef).node);
      bVar42 = pCVar25 == (Class *)PreDefined<chatra::TemporaryTuple,(chatra::StringId)157>::pdCl;
    }
    else {
      bVar42 = false;
    }
    pCVar25 = getReferClass((pTVar15->targetRef).node);
    bVar43 = pCVar25 == (Class *)PreDefined<chatra::Tuple,(chatra::StringId)156>::pdCl;
    if ((!bVar42) && (pCVar25 == (Class *)PreDefined<chatra::Tuple,(chatra::StringId)156>::pdCl)) {
      local_178._0_8_ = (pTVar15->targetRef).node;
      pRVar13 = (((ReferenceNode *)local_178._0_8_)->object->refsArray).
                super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((long)(((ReferenceNode *)local_178._0_8_)->object->refsArray).
                super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pRVar13 == 8) {
        auStack_68 = (undefined1  [8])pRVar13->node;
        Reference::setWithoutBothLock((Reference *)local_178,(Reference *)auStack_68);
        bVar43 = false;
        goto LAB_00160b17;
      }
      local_178._0_8_ = local_178 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,
                 "left side is not tuple even through value of right side is tuple","");
      auStack_68 = (undefined1  [8])0x0;
      empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      errorAtNode(&local_38->super_IErrorReceiver,Error,(Node *)srcIndex,(string *)local_178,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_68);
LAB_00161580:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_68);
      std::__cxx11::string::~string((string *)local_178);
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = &PTR__exception_002468f0;
      *(undefined4 *)(puVar28 + 1) = 0x83;
      ppuVar36 = &RuntimeException::typeinfo;
LAB_001615b7:
      __cxa_throw(puVar28,ppuVar36,std::exception::~exception);
    }
LAB_00160b17:
    if (bVar42) {
      if (!bVar43) {
        local_178._0_8_ = local_178 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_178,"right side is not tuple","");
        auStack_68 = (undefined1  [8])0x0;
        empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        errorAtNode(&local_38->super_IErrorReceiver,Error,(Node *)srcIndex,(string *)local_178,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_68);
        goto LAB_00161580;
      }
      auStack_198 = (undefined1  [8])0x0;
      map.
      super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      map.
      super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      TemporaryTuple::toArgumentMatcher
                ((ArgumentMatcher *)local_178,(TemporaryTuple *)((pTVar26->targetRef).node)->object)
      ;
      pTVar9 = (Tuple *)((pTVar15->targetRef).node)->object;
      RStack_98.node = (ReferenceNode *)0x0;
      srcRef.node = (ReferenceNode *)0x0;
      destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ref.node = (ReferenceNode *)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,
                 (long)(pTVar9->super_ObjectBase).super_Object.refsArray.
                       super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pTVar9->super_ObjectBase).super_Object.refsArray.
                       super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)auStack_68);
      lVar21 = (long)(pTVar9->super_ObjectBase).super_Object.refsArray.
                     super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pTVar9->super_ObjectBase).super_Object.refsArray.
                     super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if (lVar21 != 0) {
        lVar21 = lVar21 >> 3;
        uVar30 = 0;
        do {
          *(unsigned_long *)((long)local_1b8 + uVar30 * 8) = uVar30;
          uVar30 = uVar30 + 1;
        } while (lVar21 + (ulong)(lVar21 == 0) != uVar30);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e0,
                 ((long)(local_178._8_8_ - local_178._0_8_) >> 3) * -0x5555555555555555,
                 (allocator_type *)auStack_68);
      if (local_178._8_8_ - local_178._0_8_ != 0) {
        lVar21 = ((long)(local_178._8_8_ - local_178._0_8_) >> 3) * -0x5555555555555555;
        uVar30 = 0;
        do {
          *(unsigned_long *)((long)local_e0 + uVar30 * 8) = uVar30;
          uVar30 = uVar30 + 1;
        } while (lVar21 + (ulong)(lVar21 == 0) != uVar30);
      }
      if (local_130 != false) {
        *(unsigned_long *)((long)local_e0 + local_148 * 8) = 0xffffffffffffffff;
      }
      if (local_12f == true) {
        destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[-1] = 0xffffffffffffffff;
      }
      if ((pTVar9->super_ObjectBase).super_Object.refsArray.
          super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (pTVar9->super_ObjectBase).super_Object.refsArray.
          super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pRVar41 = (ReferenceNode *)0x0;
        do {
          pKVar22 = Tuple::key(pTVar9,(size_t)pRVar41);
          SVar4 = pKVar22->sid;
          if ((ulong)SVar4 != 0xffffffff) {
            uVar34 = (ulong)SVar4 % local_128._M_bucket_count;
            p_Var14 = local_128._M_buckets[uVar34];
            p_Var23 = (__node_base_ptr)0x0;
            if ((p_Var14 != (__node_base_ptr)0x0) &&
               (p_Var37 = p_Var14->_M_nxt, p_Var23 = p_Var14,
               SVar4 != *(StringId *)&p_Var37[1]._M_nxt)) {
              while (p_Var38 = p_Var37->_M_nxt, p_Var38 != (_Hash_node_base *)0x0) {
                p_Var23 = (__node_base_ptr)0x0;
                if (((ulong)*(StringId *)&p_Var38[1]._M_nxt % local_128._M_bucket_count != uVar34)
                   || (p_Var23 = p_Var37, p_Var37 = p_Var38,
                      SVar4 == *(StringId *)&p_Var38[1]._M_nxt)) goto LAB_00160d1c;
              }
              p_Var23 = (__node_base_ptr)0x0;
            }
LAB_00160d1c:
            if (p_Var23 == (__node_base_ptr)0x0) {
              p_Var38 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var38 = p_Var23->_M_nxt;
            }
            if (p_Var38 != (_Hash_node_base *)0x0) {
              auStack_68 = (undefined1  [8])p_Var38[2]._M_nxt;
              local_1d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)pRVar41;
              std::
              vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
              ::emplace_back<unsigned_long&,unsigned_long&,chatra::ArgumentDef::Type_const&>
                        ((vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
                          *)auStack_198,(unsigned_long *)auStack_68,(unsigned_long *)&local_1d0,
                         (Type *)(local_178._0_8_ + (long)auStack_68 * 0x18));
              *(unsigned_long *)((long)local_1b8 + pRVar41 * 8) = 0xffffffffffffffff;
              *(unsigned_long *)((long)local_e0 + p_Var38[2]._M_nxt * 8) = 0xffffffffffffffff;
            }
          }
          pRVar41 = (ReferenceNode *)((long)&pRVar41->group + 1);
        } while (pRVar41 < (ReferenceNode *)
                           ((long)(pTVar9->super_ObjectBase).super_Object.refsArray.
                                  super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pTVar9->super_ObjectBase).super_Object.refsArray.
                                  super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      local_48 = (ReferenceNode *)0x0;
      if (local_148 != (ReferenceNode *)0x0) {
        pRVar41 = (ReferenceNode *)0x0;
        do {
          if (*(pointer)((long)local_e0 + pRVar41 * 8) != 0xffffffffffffffff) {
            puVar31 = (pointer)((long)local_1b8 + local_48 * 8);
            lVar21 = (long)srcIndexes.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start - (long)puVar31 >> 5;
            if (0 < lVar21) {
              puVar31 = (pointer)((long)puVar31 +
                                 ((long)srcIndexes.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start - (long)puVar31 &
                                 0xffffffffffffffe0U));
              lVar21 = lVar21 + 1;
              puVar35 = (pointer)((long)local_1b8 +
                                 (byte *)((long)&(((Lockable *)&local_48->group)->lockRequester).
                                                 _M_i + 2) * 8);
              do {
                if (puVar35[-2] != 0xffffffffffffffff) {
                  puVar35 = puVar35 + -2;
                  goto LAB_00160e8c;
                }
                if (puVar35[-1] != 0xffffffffffffffff) {
                  puVar35 = puVar35 + -1;
                  goto LAB_00160e8c;
                }
                if (*puVar35 != 0xffffffffffffffff) goto LAB_00160e8c;
                if (puVar35[1] != 0xffffffffffffffff) {
                  puVar35 = puVar35 + 1;
                  goto LAB_00160e8c;
                }
                lVar21 = lVar21 + -1;
                puVar35 = puVar35 + 4;
              } while (1 < lVar21);
            }
            lVar21 = (long)srcIndexes.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start - (long)puVar31 >> 3;
            if (lVar21 == 1) {
LAB_00160e6f:
              puVar35 = puVar31;
              if (*puVar31 == 0xffffffffffffffff) {
                puVar35 = srcIndexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
            }
            else if (lVar21 == 2) {
LAB_00160e65:
              puVar35 = puVar31;
              if (*puVar31 == 0xffffffffffffffff) {
                puVar31 = puVar31 + 1;
                goto LAB_00160e6f;
              }
            }
            else {
              puVar35 = srcIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((lVar21 == 3) && (puVar35 = puVar31, *puVar31 == 0xffffffffffffffff)) {
                puVar31 = puVar31 + 1;
                goto LAB_00160e65;
              }
            }
LAB_00160e8c:
            if (puVar35 ==
                srcIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_start) break;
            local_1d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)((long)puVar35 - (long)local_1b8 >> 3);
            auStack_68 = (undefined1  [8])pRVar41;
            local_48 = (ReferenceNode *)
                       local_1d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            std::
            vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
            ::emplace_back<unsigned_long&,unsigned_long&,chatra::ArgumentDef::Type_const&>
                      ((vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
                        *)auStack_198,(unsigned_long *)auStack_68,(unsigned_long *)&local_1d0,
                       (Type *)(local_178._0_8_ + (long)pRVar41 * 0x18));
            *(unsigned_long *)((long)local_1b8 + local_48 * 8) = 0xffffffffffffffff;
            *(unsigned_long *)((long)local_e0 + pRVar41 * 8) = 0xffffffffffffffff;
            local_48 = (ReferenceNode *)((long)&local_48->group + 1);
          }
          pRVar41 = (ReferenceNode *)((long)&pRVar41->group + 1);
        } while (pRVar41 < local_148);
      }
      if (local_48 <
          (ReferenceNode *)
          ((long)(pTVar9->super_ObjectBase).super_Object.refsArray.
                 super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pTVar9->super_ObjectBase).super_Object.refsArray.
                 super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3)) {
        do {
          if (*(pointer)((long)local_1b8 + local_48 * 8) != 0xffffffffffffffff) {
            pKVar22 = Tuple::key(pTVar9,(size_t)local_48);
            if ((pKVar22->sid == Invalid) || (local_12f != true)) {
              if (local_130 == true) {
                this_03 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&RStack_98;
                if (srcRef.node == (ReferenceNode *)0x0) goto LAB_00160fa5;
                (srcRef.node)->group = (ReferenceGroup *)local_48;
                pRVar24 = &srcRef;
                RVar19 = srcRef;
                goto LAB_00160f90;
              }
            }
            else if (ref.node == (ReferenceNode *)0x0) {
              this_03 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                        &destIndexes.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
LAB_00160fa5:
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long&>(this_03,(iterator)0x0,(unsigned_long *)&local_48);
            }
            else {
              (ref.node)->group = (ReferenceGroup *)local_48;
              pRVar24 = &ref;
              RVar19 = ref;
LAB_00160f90:
              pRVar24->node = (ReferenceNode *)&(RVar19.node)->type;
            }
          }
          local_48 = (ReferenceNode *)
                     ((long)&(((Lockable *)&local_48->group)->lockRequester)._M_i + 1);
        } while (local_48 <
                 (ReferenceNode *)
                 ((long)(pTVar9->super_ObjectBase).super_Object.refsArray.
                        super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pTVar9->super_ObjectBase).super_Object.refsArray.
                        super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3));
      }
      if (local_130 == true) {
        local_1d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)RStack_98.node;
        local_1d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)srcRef.node;
        local_1d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        RStack_98.node = (ReferenceNode *)0x0;
        srcRef.node = (ReferenceNode *)0x0;
        auStack_68 = (undefined1  [8])local_148;
        std::
        vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
        ::
        emplace_back<unsigned_long&,std::vector<unsigned_long,std::allocator<unsigned_long>>,chatra::ArgumentDef::Type_const&>
                  ((vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
                    *)auStack_198,(unsigned_long *)auStack_68,&local_1d0,
                   (Type *)(local_178._0_8_ + (long)local_148 * 0x18));
        if ((ReferenceNode *)
            local_1d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (ReferenceNode *)0x0) {
          operator_delete(local_1d0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if (local_12f == true) {
        auStack_68 = (undefined1  [8])
                     (((long)(local_178._8_8_ - local_178._0_8_) >> 3) * -0x5555555555555555 + -1);
        local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)ref.node;
        local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ref.node = (ReferenceNode *)0x0;
        std::
        vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
        ::
        emplace_back<unsigned_long&,std::vector<unsigned_long,std::allocator<unsigned_long>>,chatra::ArgumentDef::Type_const&>
                  ((vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
                    *)auStack_198,(unsigned_long *)auStack_68,&local_218,
                   (Type *)(local_178._8_8_ + -0x18));
        if (local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_218.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      lVar21 = (long)destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start - (long)local_e0 >> 5;
      auVar32 = local_e0;
      if (0 < lVar21) {
        auVar32 = (undefined1  [8])
                  (((long)destIndexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start - (long)local_e0 & 0xffffffffffffffe0U) +
                  (long)local_e0);
        lVar21 = lVar21 + 1;
        puVar31 = (pointer)((long)local_e0 + 0x10);
        do {
          if (puVar31[-2] == 0xffffffffffffffff) {
            puVar31 = puVar31 + -2;
            goto LAB_0016128f;
          }
          if (puVar31[-1] == 0xffffffffffffffff) {
            puVar31 = puVar31 + -1;
            goto LAB_0016128f;
          }
          if (*puVar31 == 0xffffffffffffffff) goto LAB_0016128f;
          if (puVar31[1] == 0xffffffffffffffff) {
            puVar31 = puVar31 + 1;
            goto LAB_0016128f;
          }
          lVar21 = lVar21 + -1;
          puVar31 = puVar31 + 4;
        } while (1 < lVar21);
      }
      lVar21 = (long)destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start - (long)auVar32 >> 3;
      if (lVar21 == 1) {
LAB_00161178:
        puVar31 = (pointer)auVar32;
        if (*(unsigned_long *)auVar32 != 0xffffffffffffffff) {
          puVar31 = destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
      }
      else if (lVar21 == 2) {
LAB_0016116e:
        puVar31 = (pointer)auVar32;
        if (*(unsigned_long *)auVar32 != 0xffffffffffffffff) {
          auVar32 = (undefined1  [8])((long)auVar32 + 8);
          goto LAB_00161178;
        }
      }
      else {
        puVar31 = destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((lVar21 == 3) &&
           (puVar31 = (pointer)auVar32, *(unsigned_long *)auVar32 != 0xffffffffffffffff)) {
          auVar32 = (undefined1  [8])((long)auVar32 + 8);
          goto LAB_0016116e;
        }
      }
LAB_0016128f:
      puVar33 = puVar31 + 1;
      if (puVar33 !=
          destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start &&
          puVar31 !=
          destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        do {
          if (*puVar33 != 0xffffffffffffffff) {
            *puVar31 = *puVar33;
            puVar31 = puVar31 + 1;
          }
          puVar33 = puVar33 + 1;
        } while (puVar33 !=
                 destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      }
      if (puVar31 !=
          destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = puVar31;
      }
      puVar31 = destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (local_e0 !=
          (undefined1  [8])
          destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        auStack_68 = (undefined1  [8])0x0;
        empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        auVar32 = local_e0;
        do {
          local_200 = *(unsigned_long *)auVar32;
          local_ec = List;
          std::
          vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
          ::
          emplace_back<unsigned_long&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,chatra::ArgumentDef::Type>
                    ((vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
                      *)auStack_198,&local_200,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_68,&local_ec);
          auVar32 = (undefined1  [8])((long)auVar32 + 8);
        } while (auVar32 != (undefined1  [8])puVar31);
        if (auStack_68 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_68);
        }
      }
      if (local_e0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_e0);
      }
      if (local_1b8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1b8);
      }
      if (destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(destIndexes.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      }
      if (RStack_98.node != (ReferenceNode *)0x0) {
        operator_delete(RStack_98.node);
      }
      std::
      _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_unsigned_long>,_std::allocator<std::pair<const_chatra::StringId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_128);
      if ((pointer)local_178._24_8_ != (pointer)0x0) {
        operator_delete((void *)local_178._24_8_);
      }
      if ((ReferenceNode *)local_178._0_8_ != (ReferenceNode *)0x0) {
        operator_delete((void *)local_178._0_8_);
      }
      local_178._0_8_ =
           (long)pFVar6[-1].values.
                 super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)pFVar6[-1].values.
                 super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
      __position._M_current =
           pFVar6[-1].subStack.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          pFVar6[-1].subStack.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&pFVar6[-1].subStack,__position,(unsigned_long *)local_178);
      }
      else {
        *__position._M_current = local_178._0_8_;
        pFVar6[-1].subStack.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pTVar26 = Frame::pushTemporary(this_00);
      local_178._0_8_ = TemporaryObject::setRvalue(pTVar26);
      Reference::
      allocateWithoutLock<chatra::TupleAssignmentMap,std::vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>>
                ((Reference *)local_178,
                 (vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                  *)auStack_198);
      ppVar7[-1].second = 0x28;
      std::
      vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
      ::~vector((vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
                 *)auStack_198);
    }
    else {
      pCVar25 = getReferClass((pTVar15->targetRef).node);
      arg_00.cl = pCVar25;
      arg_00._0_8_ = 0xffffffff;
      TemporaryObject::addAssignment(pTVar26,(Node *)srcIndex,arg_00);
      ppVar7[-1].second = ppVar7[-1].second + 1;
    }
    unaff_R15B = 1;
    if (bVar42) goto LAB_001614a4;
switchD_00160535_caseD_7:
    EVar17 = evaluateAndAllocateForAssignment
                       (local_38,(Node *)**(undefined8 **)(srcIndex + 0x60),
                        pFVar6[-1].values.
                        super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-2]);
    if (EVar17 != Next) {
LAB_0016145d:
      unaff_R15B = 0;
      goto LAB_001614a4;
    }
switchD_00160535_caseD_8:
    pTVar26 = pFVar6[-1].values.
              super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
              ._M_impl.super__Vector_impl_data._M_finish[-2];
    TVar5 = pTVar26->type;
    uVar30 = 10;
    if (1 < TVar5 - ScopeRef) {
      if (TVar5 - FrameMethod < 2) {
        pMVar27 = TemporaryObject::getSetMethod(pTVar26);
        uVar30 = 0x14;
        if (pMVar27 != (Method *)0x0) goto LAB_0016149c;
      }
      pNVar16 = (Node *)**(undefined8 **)(srcIndex + 0x60);
      local_178._0_8_ = local_178 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,"expression is not assignable","");
      auStack_68 = (undefined1  [8])0x0;
      empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      errorAtNode(&local_38->super_IErrorReceiver,Error,pNVar16,(string *)local_178,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_68);
      goto LAB_00161580;
    }
LAB_0016149c:
    ppVar7[-1].second = uVar30;
    goto LAB_001614a1;
  default:
    goto switchD_00160535_caseD_4;
  case 7:
    goto switchD_00160535_caseD_7;
  case 8:
    goto switchD_00160535_caseD_8;
  case 10:
    ppTVar8 = pFVar6[-1].values.
              super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pTVar26 = ppTVar8[-2];
    pTVar15 = ppTVar8[-1];
    unaff_R15B = lockReference(this,pTVar26);
    if (!(bool)unaff_R15B) goto LAB_001614a4;
    RStack_98.node = (pTVar26->targetRef).node;
    if ((RStack_98.node)->group->isConst != true) {
      if ((pTVar26->hasArgs == true) &&
         (pCVar25 = getReferClass(RStack_98),
         pCVar25 == (Class *)PreDefined<chatra::FunctionObject,(chatra::StringId)159>::pdCl)) {
        ppVar7[-1].second = 0x1e;
      }
      else {
        local_178._0_8_ = (pTVar15->targetRef).node;
        Reference::setWithoutBothLock(&RStack_98,(Reference *)local_178);
        Frame::pop(this_00);
        pppVar2 = &pFVar6[-1].stack.
                   super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar2 = *pppVar2 + -1;
      }
      goto LAB_001614a4;
    }
    pNVar16 = (Node *)**(undefined8 **)(srcIndex + 0x60);
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"cannot modify constant reference","");
    auStack_68 = (undefined1  [8])0x0;
    empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    errorAtNode(&local_38->super_IErrorReceiver,Error,pNVar16,(string *)local_178,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_68);
    goto LAB_00161580;
  case 0x14:
    pFVar6[-1].stack.
    super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar7 + -1;
    methodCall(this,true);
    goto LAB_0016145d;
  }
  auStack_68 = (undefined1  [8])((ulong)auStack_68 & 0xffffffff00000000);
  std::
  vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
  ::emplace_back<chatra::Node*,int>
            ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
              *)&pFVar6[-1].stack,(Node **)local_178,(int *)auStack_68);
LAB_001614a1:
  unaff_R15B = 1;
LAB_001614a4:
  return (bool)(unaff_R15B & 1);
}

Assistant:

bool Thread::assignmentOperator() {
	auto& f = frames.back();
	auto* node = f.stack.back().first;
	auto& nodePhase = f.stack.back().second;

	constexpr size_t phaseReference = 10;
	constexpr size_t phaseMethod = 20;
	constexpr size_t phaseFunctionObject = 30;
	constexpr size_t phaseTuple = 40;

	switch (nodePhase) {
	case 0:  nodePhase++;  f.stack.emplace_back(node->subNodes[0].get(), 0);  return true;
	case 1:  nodePhase++;  f.stack.emplace_back(node->subNodes[1].get(), 0);  return true;
	case assignmentOperatorEvaluationPhase:  CHATRA_EVALUATE_VALUE;
	case assignmentOperatorEvaluationPhase + 1:  nodePhase = assignmentOperatorProcessPhase;  CHATRA_FALLTHROUGH;
	case assignmentOperatorProcessPhase: {
		// Note that node->subNode[1] cannot be accessed under specific situation
		// because following logic is also used by unaryAssignmentOperator().
		auto* v0 = *(f.values.end() - 2);
		auto* v1 = *(f.values.end() - 1);

		// Tuple <- Tuple: accept
		// Scalar <- Tuple: accept only if Tuple contains a single value
		// Tuple <- Scalar: reject
		// Scaler <- Scalar: accept

		bool v0IsTuple = (v0->getType() == TemporaryObject::Type::Rvalue &&
				getReferClass(v0->getRef()) == TemporaryTuple::getClassStatic());
		bool v1IsTuple = (getReferClass(v1->getRef()) == Tuple::getClassStatic());

		if (!v0IsTuple && v1IsTuple) {
			auto& tuple = v1->getRef().deref<Tuple>();
			if (tuple.tupleSize() != 1) {
				errorAtNode(*this, ErrorLevel::Error, node, "left side is not tuple even through value of right side is tuple", {});
				throw RuntimeException(StringId::UnsupportedOperationException);
			}
			v1->getRef().set(tuple.ref(0));
			v1IsTuple = false;
		}

		if (v0IsTuple) {
			if (!v1IsTuple) {
				errorAtNode(*this, ErrorLevel::Error, node, "right side is not tuple", {});
				throw RuntimeException(StringId::UnsupportedOperationException);
			}

			std::vector<TupleAssignmentMap::Element> map;
			v0->getRef().deref<TemporaryTuple>().toArgumentMatcher().mapReturns(v1->getRef().deref<Tuple>(),
					[&](size_t destIndex, const ArgumentDef& arg, size_t srcIndex) {
						map.emplace_back(destIndex, srcIndex, arg.type);

					}, [&](size_t destIndex, const ArgumentDef& arg, std::vector<size_t> srcIndexes) {
						map.emplace_back(destIndex, std::move(srcIndexes), arg.type);

					}, [&](const std::vector<size_t>& destIndexes) {
						std::vector<size_t> empty;
						for (size_t destIndex : destIndexes)
							map.emplace_back(destIndex, empty, ArgumentDef::Type::List);
					});

			f.subStack.push_back(f.values.size());
			f.pushTemporary()->setRvalue().allocate<TupleAssignmentMap>(std::move(map));
			nodePhase = phaseTuple;
			return true;
		}

		v0->addAssignment(node, {StringId::Invalid, getReferClass(v1->getRef())});
		nodePhase++;
		CHATRA_FALLTHROUGH;
	}

	case assignmentOperatorProcessPhase + 1:
		if (evaluateAndAllocateForAssignment(node->subNodes[0].get(), *(f.values.end() - 2)) != EvaluateValueResult::Next)
			return false;
		CHATRA_FALLTHROUGH;

	case assignmentOperatorProcessPhase + 2: {
		auto* v0 = *(f.values.end() - 2);
		switch (v0->getType()) {
		case TemporaryObject::Type::ScopeRef:
		case TemporaryObject::Type::ObjectRef:
			nodePhase = phaseReference;
			return true;

		case TemporaryObject::Type::FrameMethod:
		case TemporaryObject::Type::ObjectMethod:
			if (v0->getSetMethod() != nullptr) {
				nodePhase = phaseMethod;
				return true;
			}
			CHATRA_FALLTHROUGH;

		default:
			errorAtNode(*this, ErrorLevel::Error, node->subNodes[0].get(), "expression is not assignable", {});
			throw RuntimeException(StringId::UnsupportedOperationException);
		}
	}

	case phaseReference: { // Reference; e.g. "a = 1", "b.c = 2"
		auto* v0 = *(f.values.end() - 2);
		auto* v1 = *(f.values.end() - 1);
		if (!lockReference(v0))
			return false;
		auto ref = v0->getRef();
		if (ref.isConst()) {
			errorAtNode(*this, ErrorLevel::Error, node->subNodes[0].get(), "cannot modify constant reference", {});
			throw RuntimeException(StringId::UnsupportedOperationException);
		}
		if (v0->hasArguments() && getReferClass(ref) == FunctionObject::getClassStatic()) {
			nodePhase = phaseFunctionObject;
			return true;
		}

		ref.set(v1->getRef());
		f.pop();
		f.stack.pop_back();
		return true;
	}

	case phaseMethod: {  // Method; e.g. "a.b(...) = 1" where a is an instance of some class and its class has a method "def b(...).set(r)"
		f.stack.pop_back();
		methodCall(true);
		return false;
	}

	case phaseFunctionObject: {
		f.stack.pop_back();
		methodCallViaFunctionObject(true);
		return false;
	}

	default: {
		if (nodePhase >= phaseTuple) {  // Tuple; e.g. "a, b = foo()"
			auto& tmp = f.values[f.subStack.back() - 2]->getRef().deref<TemporaryTuple>();
			auto& tuple = f.values[f.subStack.back() - 1]->getRef().deref<Tuple>();
			auto& map = f.values[f.subStack.back()]->getRef().deref<TupleAssignmentMap>();

			constexpr size_t phasesPerElem = 1U << 2U;  // = 4
			for (;;) {
				size_t phase = nodePhase - phaseTuple;
				size_t position = phase / phasesPerElem;
				size_t subPhase = phase % phasesPerElem;

				switch (subPhase) {
				case 0: {
					if (map.map.size() <= position) {
						f.popTemporaryTuple();
						f.pop();
						f.pop();
						f.pop();
						f.pushTemporary()->setRvalue().setNull();
						f.stack.pop_back();
						f.subStack.pop_back();
						return true;
					}
					auto& e = map.map[position];
					tmp.extract(e.destIndex);

					const Class* cl;
					switch (e.type) {
					case ArgumentDef::Type::ListVarArg:  cl = Array::getClassStatic();  break;
					case ArgumentDef::Type::DictVarArg:  cl = Dict::getClassStatic();  break;
					default:  cl = (e.sourceIndexes.empty() ? nullptr : getReferClass(tuple.ref(e.sourceIndexes[0])));  break;
					}
					if (cl != nullptr)
						f.values.back()->addAssignment(node, {StringId::Invalid, cl});
					nodePhase++;
					CHATRA_FALLTHROUGH;
				}

				case 1:
					if (evaluateAndAllocateForAssignment(node->subNodes[0].get(), f.values.back()) != EvaluateValueResult::Next)
						return false;
					CHATRA_FALLTHROUGH;

				case 2: {
					auto* v0 = f.values.back();
					switch (v0->getType()) {
					case TemporaryObject::Type::ScopeRef:
					case TemporaryObject::Type::ObjectRef:
						break;

					case TemporaryObject::Type::FrameMethod:
					case TemporaryObject::Type::ObjectMethod:
						if (v0->getSetMethod() != nullptr)
							break;
						CHATRA_FALLTHROUGH;

					default:
						errorAtNode(*this, ErrorLevel::Error, node->subNodes[0].get(), "expression is not assignable", {});
						throw RuntimeException(StringId::UnsupportedOperationException);
					}
					nodePhase++;
					CHATRA_FALLTHROUGH;
				}

				default: {
					auto& e = map.map[position];
					auto srcRef = f.pushTemporary()->setRvalue();
					switch (e.type) {
					case ArgumentDef::Type::ListVarArg: {
						auto& array = srcRef.allocate<Array>();
						for (size_t sourceIndex : e.sourceIndexes)
							array.add(tuple.ref(sourceIndex));
						break;
					}

					case ArgumentDef::Type::DictVarArg: {
						auto& dict = srcRef.allocate<Dict>();
						for (size_t sourceIndex : e.sourceIndexes) {
							auto& key = tuple.key(sourceIndex);
							dict.add(key.sid == StringId::Invalid ? key.str : sTable->ref(key.sid),
									tuple.ref(sourceIndex));
						}
						break;
					}

					default:
						if (e.sourceIndexes.empty())
							srcRef.setNull();
						else
							srcRef.set(tuple.ref(e.sourceIndexes[0]));
						break;
					}

					auto* v0 = *(f.values.end() - 2);
					if (v0->hasRef()) {
						if (!lockReference(v0))
							return false;
						auto ref = v0->getRef();
						if (ref.isConst()) {
							errorAtNode(*this, ErrorLevel::Error, node->subNodes[0].get(), "cannot modify constant reference", {});
							throw RuntimeException(StringId::UnsupportedOperationException);
						}
						if (v0->hasArguments() && getReferClass(ref) == FunctionObject::getClassStatic()) {
							nodePhase = phaseTuple + (position + 1) * phasesPerElem;
							methodCallViaFunctionObject(true);
							return false;
						}

						ref.set(srcRef);
						f.pop();
						f.pop();
						nodePhase = phaseTuple + (position + 1) * phasesPerElem;
					}
					else {
						nodePhase = phaseTuple + (position + 1) * phasesPerElem;
						methodCall(true);
						return false;
					}
				}
				}
			}
		}
		throw InternalError();
	}
	}
}